

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>
fmt::v5::internal::
format_decimal<char,unsigned_long,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::add_thousands_sep<char>>
          (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> out,
          unsigned_long value,int num_digits,add_thousands_sep<char> sep)

{
  char *__last;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  char_type buffer [26];
  char local_38 [40];
  
  __last = format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
                     (local_38,value,num_digits,sep);
  bVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (local_38,__last,out);
  return (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)bVar1.container;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}